

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_inline_nested(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  undefined8 extraout_RAX;
  undefined1 *puVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  undefined1 *puVar17;
  bson_t *pbVar18;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar19;
  bson_t expected;
  bson_t bcon;
  bson_t third;
  bson_t bar;
  bson_t foo;
  undefined8 uStack_73d0;
  uint8_t *puStack_73c8;
  undefined1 *puStack_73c0;
  undefined1 auStack_73b0 [8];
  void *pvStack_73a8;
  undefined8 uStack_7398;
  undefined8 uStack_7390;
  char *pcStack_7388;
  undefined8 uStack_7370;
  undefined1 auStack_7300 [25944];
  void *pvStack_da8;
  char *pcStack_da0;
  char *pcStack_d98;
  char *pcStack_d90;
  code *pcStack_d88;
  bson_t bStack_d80;
  undefined1 auStack_d00 [4];
  uint uStack_cfc;
  undefined1 auStack_c80 [336];
  void *pvStack_b30;
  ulong uStack_b28;
  undefined1 *puStack_b20;
  ulong uStack_b18;
  void *pvStack_b10;
  code *pcStack_b08;
  undefined1 auStack_b00 [4];
  uint uStack_afc;
  void *pvStack_9b0;
  undefined1 *puStack_9a8;
  undefined1 *puStack_9a0;
  void *pvStack_998;
  ulong uStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [4];
  uint uStack_97c;
  undefined1 auStack_900 [4];
  uint uStack_8fc;
  undefined1 auStack_880 [336];
  void *pvStack_730;
  undefined1 *puStack_728;
  undefined1 *puStack_720;
  char *pcStack_718;
  char *pcStack_710;
  code *apcStack_708 [16];
  undefined8 uStack_688;
  undefined1 auStack_680 [4];
  uint uStack_67c;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  undefined1 auStack_580 [128];
  undefined1 auStack_500 [280];
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_3c0;
  char *pcStack_3b8;
  char *pcStack_3b0;
  char *pcStack_3a8;
  char *pcStack_3a0;
  char *pcStack_398;
  char *pcStack_390;
  code *pcStack_388;
  undefined1 auStack_380 [4];
  uint local_37c;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  puVar17 = auStack_380;
  pcStack_388 = (code *)0x13b516;
  bson_init(local_300);
  pcStack_388 = (code *)0x13b521;
  bson_init(auStack_380);
  pcStack_388 = (code *)0x13b531;
  bson_init(local_180);
  pcStack_388 = (code *)0x13b541;
  bson_init(local_200);
  pcStack_388 = (code *)0x13b551;
  bson_init(local_280);
  pcStack_388 = (code *)0x13b572;
  bson_append_utf8(local_280,"hello",0xffffffff,"world",0xffffffff);
  pcStack_388 = (code *)0x13b58b;
  bson_append_int32(local_200,"0",0xffffffff,1);
  pcStack_388 = (code *)0x13b5a4;
  bson_append_int32(local_200,"1",0xffffffff,2);
  pcStack_388 = (code *)0x13b5bb;
  bson_append_document(local_200,"2",0xffffffff,local_280);
  pcStack_388 = (code *)0x13b5d5;
  bson_append_array(local_180,"bar",0xffffffff,local_200);
  pcStack_388 = (code *)0x13b5ef;
  bson_append_document(auStack_380,"foo",0xffffffff,local_180);
  pcStack_388 = (code *)0x13b5f4;
  uStack_3d0 = bson_bcon_magic();
  pcStack_388 = (code *)0x0;
  pcStack_390 = "}";
  pcStack_398 = "]";
  pcStack_3a0 = "}";
  pcStack_3a8 = "world";
  pcStack_3b0 = "hello";
  pcStack_3b8 = "{";
  uStack_3c0 = 2;
  uStack_3c8 = 0xf;
  uStack_3d8 = 1;
  uStack_3e0 = 0xf;
  uStack_3e8 = 0x13b64e;
  bcon_append(local_300,"foo","{","bar","[");
  pcStack_388 = (code *)0x13b65a;
  pvVar4 = (void *)bson_get_data(local_300);
  pcStack_388 = (code *)0x13b665;
  pvVar5 = (void *)bson_get_data(auStack_380);
  if (local_37c == local_2fc) {
    pcStack_388 = (code *)0x13b67e;
    pvVar6 = (void *)bson_get_data(auStack_380);
    pcStack_388 = (code *)0x13b68e;
    pvVar7 = (void *)bson_get_data(local_300);
    pcStack_388 = (code *)0x13b69d;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)local_37c);
    if (iVar1 == 0) {
      pcStack_388 = (code *)0x13b6ae;
      bson_destroy(local_300);
      pcStack_388 = (code *)0x13b6b6;
      bson_destroy(auStack_380);
      pcStack_388 = (code *)0x13b6c3;
      bson_destroy(local_180);
      pcStack_388 = (code *)0x13b6d0;
      bson_destroy(local_200);
      pcStack_388 = (code *)0x13b6dd;
      bson_destroy(local_280);
      return;
    }
  }
  puVar11 = local_300;
  pcStack_388 = (code *)0x13b6fe;
  uVar8 = bson_as_canonical_extended_json(puVar11,0);
  pcStack_388 = (code *)0x13b70e;
  uVar9 = bson_as_canonical_extended_json(auStack_380,0);
  uVar2 = local_37c;
  if (local_2fc < local_37c) {
    uVar2 = local_2fc;
  }
  if (uVar2 != 0) {
    uVar2 = local_37c;
    if (local_2fc <= local_37c) {
      uVar2 = local_2fc;
    }
    uVar13 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar13) != *(char *)((long)pvVar5 + uVar13)) {
        uVar13 = uVar13 & 0xffffffff;
        goto LAB_0013b749;
      }
      uVar13 = uVar13 + 1;
    } while (uVar2 != (uint)uVar13);
  }
  uVar2 = local_2fc;
  if (local_2fc < local_37c) {
    uVar2 = local_37c;
  }
  uVar13 = (ulong)(uVar2 - 1);
LAB_0013b749:
  pcStack_388 = (code *)0x13b767;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,uVar8,uVar9);
  pcStack_388 = (code *)0x13b77f;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_388 = (code *)0x13b79a;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013b7e6:
    pcStack_388 = (code *)0x13b7eb;
    test_inline_nested_cold_5();
LAB_0013b7eb:
    pcStack_388 = (code *)0x13b7f0;
    test_inline_nested_cold_4();
LAB_0013b7f0:
    pcStack_388 = (code *)0x13b7f5;
    test_inline_nested_cold_1();
  }
  else {
    puVar11 = (undefined1 *)(ulong)uVar3;
    puVar17 = auStack_380;
    if (uVar3 == 0xffffffff) goto LAB_0013b7eb;
    puVar17 = (undefined1 *)(ulong)local_2fc;
    pcStack_388 = (code *)0x13b7be;
    puVar10 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar17);
    if (puVar10 != puVar17) goto LAB_0013b7f0;
    pvVar4 = (void *)(ulong)local_37c;
    pcStack_388 = (code *)0x13b7d6;
    pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
    if (pvVar6 == pvVar4) {
      pcStack_388 = (code *)0x13b7e6;
      test_inline_nested_cold_3();
      goto LAB_0013b7e6;
    }
  }
  pcStack_388 = test_concat;
  test_inline_nested_cold_2();
  apcStack_708[0] = (code *)0x13b822;
  pcStack_3b0 = (char *)pvVar5;
  pcStack_3a8 = puVar11;
  pcStack_3a0 = puVar17;
  pcStack_398 = (char *)pvVar4;
  pcStack_390 = (char *)(ulong)uVar2;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_600);
  apcStack_708[0] = (code *)0x13b832;
  bson_init(auStack_680);
  apcStack_708[0] = (code *)0x13b842;
  bson_init(auStack_580);
  apcStack_708[0] = (code *)0x13b852;
  bson_init(auStack_500);
  apcStack_708[0] = (code *)0x13b873;
  bson_append_utf8(auStack_580,"hello",0xffffffff,"world",0xffffffff);
  apcStack_708[0] = (code *)0x13b88d;
  bson_append_document(auStack_680,"foo",0xffffffff,auStack_580);
  apcStack_708[0] = (code *)0x13b892;
  uStack_688 = bson_bcon_magic();
  apcStack_708[0] = (code *)0x0;
  pcStack_710 = "}";
  pcStack_718 = (char *)0x13b8c2;
  bcon_append(auStack_600,"foo","{",uStack_688,0x15,auStack_580);
  apcStack_708[0] = (code *)0x13b8ce;
  pvVar4 = (void *)bson_get_data(auStack_600);
  apcStack_708[0] = (code *)0x13b8d9;
  pvVar5 = (void *)bson_get_data(auStack_680);
  if (uStack_67c == uStack_5fc) {
    apcStack_708[0] = (code *)0x13b8fa;
    pvVar6 = (void *)bson_get_data(auStack_680);
    apcStack_708[0] = (code *)0x13b90a;
    pvVar7 = (void *)bson_get_data(auStack_600);
    apcStack_708[0] = (code *)0x13b919;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_67c);
    if (iVar1 != 0) goto LAB_0013babb;
    apcStack_708[0] = (code *)0x13b92e;
    bson_reinit(auStack_600);
    apcStack_708[0] = (code *)0x13b93b;
    bson_reinit(auStack_680);
    apcStack_708[0] = (code *)0x13b94b;
    bson_reinit(auStack_580);
    apcStack_708[0] = (code *)0x13b96f;
    bson_append_utf8(auStack_580,"0",0xffffffff,"bar",0xffffffff);
    apcStack_708[0] = (code *)0x13b993;
    bson_append_utf8(auStack_580,"1",0xffffffff,"baz",0xffffffff);
    apcStack_708[0] = (code *)0x13b9b2;
    bson_append_array(auStack_680,"foo",0xffffffff,auStack_580);
    apcStack_708[0] = (code *)0x13b9cb;
    bson_append_utf8(auStack_500,"0",0xffffffff,"baz",0xffffffff);
    pcStack_710 = (char *)0x0;
    pcStack_718 = "]";
    puStack_728 = (undefined1 *)0x13ba0d;
    puStack_720 = auStack_500;
    bcon_append(auStack_600,"foo","[","bar",uStack_688,0x15);
    apcStack_708[0] = (code *)0x13ba1c;
    pvVar4 = (void *)bson_get_data(auStack_600);
    apcStack_708[0] = (code *)0x13ba2f;
    pvVar5 = (void *)bson_get_data(auStack_680);
    if (uStack_67c == uStack_5fc) {
      apcStack_708[0] = (code *)0x13ba51;
      pvVar6 = (void *)bson_get_data(auStack_680);
      apcStack_708[0] = (code *)0x13ba61;
      pvVar7 = (void *)bson_get_data(auStack_600);
      apcStack_708[0] = (code *)0x13ba70;
      iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_67c);
      if (iVar1 == 0) {
        apcStack_708[0] = (code *)0x13ba85;
        bson_destroy(auStack_600);
        apcStack_708[0] = (code *)0x13ba92;
        bson_destroy(auStack_580);
        apcStack_708[0] = (code *)0x13ba9f;
        bson_destroy(auStack_500);
        apcStack_708[0] = (code *)0x13baac;
        bson_destroy(auStack_680);
        return;
      }
    }
    puVar17 = auStack_600;
    apcStack_708[0] = (code *)0x13bb2d;
    uVar13 = bson_as_canonical_extended_json(puVar17,0);
    puVar11 = auStack_680;
    apcStack_708[0] = (code *)0x13bb42;
    uVar8 = bson_as_canonical_extended_json(puVar11,0);
    uVar2 = uStack_67c;
    if (uStack_5fc < uStack_67c) {
      uVar2 = uStack_5fc;
    }
    if (uVar2 != 0) {
      uVar2 = uStack_67c;
      if (uStack_5fc <= uStack_67c) {
        uVar2 = uStack_5fc;
      }
      uVar14 = 0;
      do {
        if (*(char *)((long)pvVar4 + uVar14) != *(char *)((long)pvVar5 + uVar14)) goto LAB_0013bc34;
        uVar14 = uVar14 + 1;
      } while (uVar2 != (uint)uVar14);
    }
    uVar2 = uStack_5fc;
    if (uStack_5fc < uStack_67c) {
      uVar2 = uStack_67c;
    }
    uVar14 = (ulong)(uVar2 - 1);
LAB_0013bc36:
    apcStack_708[0] = (code *)0x13bc54;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar13,uVar8);
    apcStack_708[0] = (code *)0x13bc6c;
    uVar2 = open("failure.bad.bson",0x42,0x1a0);
    uVar13 = (ulong)uVar2;
    apcStack_708[0] = (code *)0x13bc87;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar2 == 0xffffffff) goto LAB_0013bcea;
    puVar17 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bcef;
    puVar11 = (undefined1 *)(ulong)uStack_5fc;
    apcStack_708[0] = (code *)0x13bcab;
    puVar10 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar11);
    if (puVar10 != puVar11) goto LAB_0013bcf4;
    pvVar4 = (void *)(ulong)uStack_67c;
    apcStack_708[0] = (code *)0x13bcc6;
    pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
    if (pvVar6 == pvVar4) {
      apcStack_708[0] = (code *)0x13bcd6;
      test_concat_cold_8();
      goto LAB_0013bcd6;
    }
  }
  else {
LAB_0013babb:
    puVar17 = auStack_600;
    apcStack_708[0] = (code *)0x13bacd;
    uVar8 = bson_as_canonical_extended_json(puVar17,0);
    puVar11 = auStack_680;
    apcStack_708[0] = (code *)0x13bae2;
    uVar9 = bson_as_canonical_extended_json(puVar11,0);
    uVar2 = uStack_67c;
    if (uStack_5fc < uStack_67c) {
      uVar2 = uStack_5fc;
    }
    if (uVar2 != 0) {
      uVar2 = uStack_67c;
      if (uStack_5fc <= uStack_67c) {
        uVar2 = uStack_5fc;
      }
      uVar13 = 0;
      do {
        if (*(char *)((long)pvVar4 + uVar13) != *(char *)((long)pvVar5 + uVar13)) {
          uVar13 = uVar13 & 0xffffffff;
          goto LAB_0013bb84;
        }
        uVar13 = uVar13 + 1;
      } while (uVar2 != (uint)uVar13);
    }
    uVar2 = uStack_5fc;
    if (uStack_5fc < uStack_67c) {
      uVar2 = uStack_67c;
    }
    uVar13 = (ulong)(uVar2 - 1);
LAB_0013bb84:
    apcStack_708[0] = (code *)0x13bba2;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,uVar8,uVar9);
    apcStack_708[0] = (code *)0x13bbba;
    uVar2 = open("failure.bad.bson",0x42,0x1a0);
    uVar13 = (ulong)uVar2;
    apcStack_708[0] = (code *)0x13bbd5;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar2 == 0xffffffff) {
LAB_0013bcd6:
      apcStack_708[0] = (code *)0x13bcdb;
      test_concat_cold_5();
LAB_0013bcdb:
      apcStack_708[0] = (code *)0x13bce0;
      test_concat_cold_4();
LAB_0013bce0:
      apcStack_708[0] = (code *)0x13bce5;
      test_concat_cold_1();
    }
    else {
      puVar17 = (undefined1 *)(ulong)uVar3;
      if (uVar3 == 0xffffffff) goto LAB_0013bcdb;
      puVar11 = (undefined1 *)(ulong)uStack_5fc;
      apcStack_708[0] = (code *)0x13bc01;
      puVar10 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar11);
      if (puVar10 != puVar11) goto LAB_0013bce0;
      pvVar4 = (void *)(ulong)uStack_67c;
      apcStack_708[0] = (code *)0x13bc20;
      pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
      if (pvVar6 == pvVar4) {
        apcStack_708[0] = (code *)0x13bc34;
        uVar14 = uVar13;
        test_concat_cold_3();
        uVar8 = extraout_RAX;
LAB_0013bc34:
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0013bc36;
      }
    }
    apcStack_708[0] = (code *)0x13bcea;
    test_concat_cold_2();
LAB_0013bcea:
    apcStack_708[0] = (code *)0x13bcef;
    test_concat_cold_10();
LAB_0013bcef:
    apcStack_708[0] = (code *)0x13bcf4;
    test_concat_cold_9();
LAB_0013bcf4:
    apcStack_708[0] = (code *)0x13bcf9;
    test_concat_cold_6();
  }
  apcStack_708[0] = test_iter;
  test_concat_cold_7();
  puVar10 = auStack_980;
  pcStack_988 = (code *)0x13bd26;
  pvStack_730 = pvVar5;
  puStack_728 = puVar17;
  puStack_720 = puVar11;
  pcStack_718 = (char *)pvVar4;
  pcStack_710 = (char *)uVar13;
  apcStack_708[0] = (code *)&pcStack_388;
  bson_init(auStack_900);
  pcStack_988 = (code *)0x13bd31;
  bson_init(auStack_980);
  pcStack_988 = (code *)0x13bd4d;
  bson_append_int32(auStack_980,"foo",0xffffffff,100);
  pcStack_988 = (code *)0x13bd63;
  bson_iter_init_find(auStack_880,auStack_980,"foo");
  pcStack_988 = (code *)0x13bd68;
  uVar8 = bson_bcon_magic();
  pcStack_988 = (code *)0x13bd83;
  bcon_append(auStack_900,"foo",uVar8,0x1d,auStack_880,0);
  pcStack_988 = (code *)0x13bd8b;
  pvVar4 = (void *)bson_get_data(auStack_900);
  pcStack_988 = (code *)0x13bd96;
  pvVar5 = (void *)bson_get_data(auStack_980);
  if (uStack_97c == uStack_8fc) {
    pcStack_988 = (code *)0x13bdaf;
    pvVar6 = (void *)bson_get_data(auStack_980);
    pcStack_988 = (code *)0x13bdbf;
    pvVar7 = (void *)bson_get_data(auStack_900);
    pcStack_988 = (code *)0x13bdce;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_97c);
    if (iVar1 == 0) {
      pcStack_988 = (code *)0x13bddf;
      bson_destroy(auStack_900);
      pcStack_988 = (code *)0x13bde7;
      bson_destroy(auStack_980);
      return;
    }
  }
  puVar17 = auStack_900;
  pcStack_988 = (code *)0x13be08;
  uVar8 = bson_as_canonical_extended_json(puVar17,0);
  pcStack_988 = (code *)0x13be18;
  uVar9 = bson_as_canonical_extended_json(auStack_980,0);
  uVar2 = uStack_97c;
  if (uStack_8fc < uStack_97c) {
    uVar2 = uStack_8fc;
  }
  if (uVar2 != 0) {
    uVar2 = uStack_97c;
    if (uStack_8fc <= uStack_97c) {
      uVar2 = uStack_8fc;
    }
    uVar13 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar13) != *(char *)((long)pvVar5 + uVar13)) {
        uVar13 = uVar13 & 0xffffffff;
        goto LAB_0013be53;
      }
      uVar13 = uVar13 + 1;
    } while (uVar2 != (uint)uVar13);
  }
  uVar2 = uStack_8fc;
  if (uStack_8fc < uStack_97c) {
    uVar2 = uStack_97c;
  }
  uVar13 = (ulong)(uVar2 - 1);
LAB_0013be53:
  pcStack_988 = (code *)0x13be71;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,uVar8,uVar9);
  pcStack_988 = (code *)0x13be89;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_988 = (code *)0x13bea4;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013bef0:
    pcStack_988 = (code *)0x13bef5;
    test_iter_cold_5();
LAB_0013bef5:
    pcStack_988 = (code *)0x13befa;
    test_iter_cold_4();
LAB_0013befa:
    pcStack_988 = (code *)0x13beff;
    test_iter_cold_1();
  }
  else {
    puVar17 = (undefined1 *)(ulong)uVar3;
    puVar10 = auStack_980;
    if (uVar3 == 0xffffffff) goto LAB_0013bef5;
    puVar10 = (undefined1 *)(ulong)uStack_8fc;
    pcStack_988 = (code *)0x13bec8;
    puVar11 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar10);
    if (puVar11 != puVar10) goto LAB_0013befa;
    pvVar4 = (void *)(ulong)uStack_97c;
    pcStack_988 = (code *)0x13bee0;
    pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
    if (pvVar6 == pvVar4) {
      pcStack_988 = (code *)0x13bef0;
      test_iter_cold_3();
      goto LAB_0013bef0;
    }
  }
  pcStack_988 = test_bcon_new;
  test_iter_cold_2();
  puVar11 = auStack_b00;
  pcStack_b08 = (code *)0x13bf27;
  pvStack_9b0 = pvVar5;
  puStack_9a8 = puVar17;
  puStack_9a0 = puVar10;
  pvStack_998 = pvVar4;
  uStack_990 = (ulong)uVar2;
  pcStack_988 = (code *)apcStack_708;
  bson_init(auStack_b00);
  pcStack_b08 = (code *)0x13bf4e;
  bson_append_utf8(auStack_b00,"hello",0xffffffff,"world",0xffffffff);
  pcStack_b08 = (code *)0x13bf5f;
  uVar13 = bcon_new(0,"hello","world",0);
  pcStack_b08 = (code *)0x13bf6a;
  pvVar4 = (void *)bson_get_data(uVar13);
  pcStack_b08 = (code *)0x13bf75;
  pvVar5 = (void *)bson_get_data(auStack_b00);
  if (uStack_afc == *(uint *)(uVar13 + 4)) {
    pcStack_b08 = (code *)0x13bf8e;
    pvVar6 = (void *)bson_get_data(auStack_b00);
    pcStack_b08 = (code *)0x13bf99;
    pvVar7 = (void *)bson_get_data(uVar13);
    pcStack_b08 = (code *)0x13bfa9;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_afc);
    if (iVar1 == 0) {
      pcStack_b08 = (code *)0x13bfb5;
      bson_destroy(uVar13);
      pcStack_b08 = (code *)0x13bfbd;
      bson_destroy(auStack_b00);
      return;
    }
  }
  pcStack_b08 = (code *)0x13bfd6;
  uVar8 = bson_as_canonical_extended_json(uVar13,0);
  pcStack_b08 = (code *)0x13bfe6;
  uVar9 = bson_as_canonical_extended_json(auStack_b00,0);
  uVar2 = *(uint *)(uVar13 + 4);
  uVar3 = uStack_afc;
  if (uVar2 < uStack_afc) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_afc;
    if (uVar2 <= uStack_afc) {
      uVar3 = uVar2;
    }
    uVar14 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar14) != *(char *)((long)pvVar5 + uVar14)) {
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0013c020;
      }
      uVar14 = uVar14 + 1;
    } while (uVar3 != (uint)uVar14);
  }
  if (uVar2 < uStack_afc) {
    uVar2 = uStack_afc;
  }
  uVar14 = (ulong)(uVar2 - 1);
LAB_0013c020:
  pcStack_b08 = (code *)0x13c03e;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar8,uVar9);
  pcStack_b08 = (code *)0x13c056;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_b08 = (code *)0x13c071;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c0b9:
    pcStack_b08 = (code *)0x13c0be;
    test_bcon_new_cold_5();
LAB_0013c0be:
    pcStack_b08 = (code *)0x13c0c3;
    test_bcon_new_cold_4();
LAB_0013c0c3:
    pcStack_b08 = (code *)0x13c0c8;
    test_bcon_new_cold_1();
  }
  else {
    puVar11 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c0be;
    uVar13 = (ulong)*(uint *)(uVar13 + 4);
    pcStack_b08 = (code *)0x13c091;
    uVar14 = write(uVar2,pvVar4,uVar13);
    if (uVar14 != uVar13) goto LAB_0013c0c3;
    uVar13 = (ulong)uStack_afc;
    pcStack_b08 = (code *)0x13c0a9;
    uVar14 = write(uVar3,pvVar5,uVar13);
    if (uVar14 == uVar13) {
      pcStack_b08 = (code *)0x13c0b9;
      test_bcon_new_cold_3();
      goto LAB_0013c0b9;
    }
  }
  pcStack_b08 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar18 = &bStack_d80;
  pcStack_d88 = (code *)0x13c0ed;
  pvStack_b30 = pvVar5;
  uStack_b28 = (ulong)uVar2;
  puStack_b20 = puVar11;
  uStack_b18 = uVar13;
  pvStack_b10 = pvVar4;
  pcStack_b08 = (code *)&pcStack_988;
  bson_init(&bStack_d80);
  pcStack_d88 = (code *)0x13c0fd;
  bson_init(auStack_d00);
  pcStack_d88 = (code *)0x13c10d;
  bson_init(auStack_c80);
  pcStack_d88 = (code *)0x13c12e;
  bson_append_utf8(auStack_c80,"c",0xffffffff,"d",0xffffffff);
  pcStack_d88 = (code *)0x13c155;
  bson_append_utf8(auStack_c80,"e",0xffffffff,"f",0xffffffff);
  pcStack_d88 = (code *)0x13c16f;
  bson_append_document(auStack_d00,"a",0xffffffff,auStack_c80);
  pcVar16 = "e";
  pcStack_d90 = (char *)0x0;
  pcStack_d98 = "}";
  pcStack_da0 = "f";
  pvStack_da8 = (void *)0x13c1a4;
  test_append_ctx_helper(&bStack_d80,"a","{",0,"add magic");
  pcStack_d88 = (code *)0x13c1b3;
  pvVar4 = (void *)bson_get_data(&bStack_d80);
  pcStack_d88 = (code *)0x13c1be;
  pvVar5 = (void *)bson_get_data(auStack_d00);
  if (uStack_cfc == bStack_d80.len) {
    pcStack_d88 = (code *)0x13c1dc;
    pvVar6 = (void *)bson_get_data(auStack_d00);
    pcStack_d88 = (code *)0x13c1e7;
    pvVar7 = (void *)bson_get_data(&bStack_d80);
    pcStack_d88 = (code *)0x13c1f6;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_cfc);
    if (iVar1 == 0) {
      pcStack_d88 = (code *)0x13c202;
      bson_destroy(&bStack_d80);
      pcStack_d88 = (code *)0x13c20f;
      bson_destroy(auStack_d00);
      pcStack_d88 = (code *)0x13c21c;
      bson_destroy(auStack_c80);
      return;
    }
  }
  pcStack_d88 = (code *)0x13c238;
  uVar8 = bson_as_canonical_extended_json(&bStack_d80,0);
  pcStack_d88 = (code *)0x13c24d;
  uVar9 = bson_as_canonical_extended_json(auStack_d00,0);
  uVar12 = uStack_cfc;
  if (bStack_d80.len < uStack_cfc) {
    uVar12 = bStack_d80.len;
  }
  if (uVar12 != 0) {
    uVar12 = uStack_cfc;
    if (bStack_d80.len <= uStack_cfc) {
      uVar12 = bStack_d80.len;
    }
    uVar13 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar13) != *(char *)((long)pvVar5 + uVar13)) {
        uVar13 = uVar13 & 0xffffffff;
        goto LAB_0013c288;
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != (uint)uVar13);
  }
  uVar2 = bStack_d80.len;
  if (bStack_d80.len < uStack_cfc) {
    uVar2 = uStack_cfc;
  }
  uVar13 = (ulong)(uVar2 - 1);
LAB_0013c288:
  pcStack_d88 = (code *)0x13c2a6;
  uVar19 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13);
  pcStack_d88 = (code *)0x13c2be;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar15 = "failure.expected.bson";
  pvVar6 = (void *)0x42;
  pcStack_d88 = (code *)0x13c2d9;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c325:
    pcStack_d88 = (code *)0x13c32a;
    test_append_ctx_cold_5();
LAB_0013c32a:
    pcStack_d88 = (code *)0x13c32f;
    test_append_ctx_cold_4();
  }
  else {
    pbVar18 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c32a;
    pcVar15 = (char *)(ulong)uVar2;
    pcStack_d88 = (code *)0x13c2fa;
    pvVar6 = pvVar4;
    uVar13 = write(uVar2,pvVar4,(ulong)bStack_d80.len);
    if (uVar13 == bStack_d80.len) {
      pvVar4 = (void *)(ulong)uStack_cfc;
      pcStack_d88 = (code *)0x13c315;
      pvVar6 = pvVar5;
      pcVar15 = (char *)pbVar18;
      pvVar7 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
      if (pvVar7 != pvVar4) goto LAB_0013c334;
      pvVar6 = (void *)(ulong)uVar3;
      pcStack_d88 = (code *)0x13c325;
      pcVar15 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013c325;
    }
  }
  pcStack_d88 = (code *)0x13c334;
  test_append_ctx_cold_1();
LAB_0013c334:
  pcStack_d88 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_73c0 = auStack_73b0;
  if (extraout_AL != '\0') {
    uStack_7370 = uVar19;
  }
  pvStack_73a8 = pvVar6;
  uStack_7398 = uVar8;
  uStack_7390 = uVar9;
  pcStack_7388 = pcVar16;
  pvStack_da8 = pvVar5;
  pcStack_da0 = (char *)pbVar18;
  pcStack_d98 = (char *)pvVar4;
  pcStack_d90 = (char *)(ulong)uVar2;
  pcStack_d88 = (code *)&pcStack_b08;
  bcon_append_ctx_init(auStack_7300);
  puStack_73c8 = bStack_d80.padding;
  uStack_73d0 = 0x3000000008;
  bcon_append_ctx_va(pcVar15,auStack_7300,&uStack_73d0);
  if ((uint)uStack_73d0 < 0x29) {
    uStack_73d0 = CONCAT44(uStack_73d0._4_4_,(uint)uStack_73d0 + 8);
  }
  else {
    puStack_73c8 = puStack_73c8 + 8;
  }
  bcon_append_ctx(pcVar15,auStack_7300,"c","d",0);
  bcon_append_ctx_va(pcVar15,auStack_7300,&uStack_73d0);
  return;
}

Assistant:

static void
test_inline_nested (void)
{
   bson_t bcon, expected, foo, bar, third;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&foo);
   bson_init (&bar);
   bson_init (&third);

   bson_append_utf8 (&third, "hello", -1, "world", -1);
   bson_append_int32 (&bar, "0", -1, 1);
   bson_append_int32 (&bar, "1", -1, 2);
   bson_append_document (&bar, "2", -1, &third);
   bson_append_array (&foo, "bar", -1, &bar);
   bson_append_document (&expected, "foo", -1, &foo);

   BCON_APPEND (&bcon,
                "foo",
                "{",
                "bar",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                "{",
                "hello",
                "world",
                "}",
                "]",
                "}");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&foo);
   bson_destroy (&bar);
   bson_destroy (&third);
}